

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O2

void __thiscall LinearScan::Init(LinearScan *this)

{
  byte bVar1;
  bool bVar2;
  uint sourceContextId;
  uint functionId;
  RegNum reg;
  BVIndex index;
  ulong uVar3;
  long lVar4;
  
  uVar3 = 1;
  for (lVar4 = 0x3b0; lVar4 != 0x4b0; lVar4 = lVar4 + 8) {
    bVar1 = "\x01\f\f\f\n\x01\x01\x04\x04\f\f\f\f\n\n\n\n"[uVar3];
    index = (BVIndex)uVar3;
    if ((bVar1 & 1) != 0) {
      BVUnitT<unsigned_long>::Set(&this->activeRegs,index);
      bVar2 = IRType_IsFloat(RegTypes[uVar3]);
      if (bVar2) {
        this->floatRegUsedCount = this->floatRegUsedCount + 1;
      }
      else {
        this->intRegUsedCount = this->intRegUsedCount + 1;
      }
    }
    BVUnitT<unsigned_long>::Set(&this->int32Regs + (ulong)(0x10 < uVar3) * 2,index);
    (&this->numInt32Regs)[(ulong)(0x10 < uVar3) * 4] =
         (&this->numInt32Regs)[(ulong)(0x10 < uVar3) * 4] + 1;
    if ((bVar1 & 3) == 0) {
      BVUnitT<unsigned_long>::Set(&this->callerSavedRegs,index);
    }
    if ((bVar1 & 2) != 0) {
      BVUnitT<unsigned_long>::Set(&this->calleeSavedRegs,index);
    }
    *(undefined8 *)((long)&this->func + lVar4) = 0;
    uVar3 = uVar3 + 1;
  }
  (this->instrUseRegs).word = 0;
  (this->secondChanceRegs).word = 0;
  (this->linearScanMD).super_LinearScanMDShared.linearScan = this;
  (this->nonAllocatableRegs).word = (this->activeRegs).word;
  sourceContextId = Func::GetSourceContextId(this->func);
  functionId = Func::GetLocalFunctionId(this->func);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,LinearScanPhase,sourceContextId,functionId);
  if (bVar2) {
    Func::DumpHeader(this->func);
    return;
  }
  return;
}

Assistant:

void
LinearScan::Init()
{
    FOREACH_REG(reg)
    {
        // Registers that can't be used are set to active, and will remain this way
        if (!LinearScan::IsAllocatable(reg))
        {
            this->activeRegs.Set(reg);
            if (IRType_IsFloat(RegTypes[reg]))
            {
                this->floatRegUsedCount++;
            }
            else
            {
                this->intRegUsedCount++;
            }
        }
        if (RegTypes[reg] == TyMachReg)
        {
            // JIT64_TODO: Rename int32Regs to machIntRegs.
            this->int32Regs.Set(reg);
            numInt32Regs++;
        }
        else if (RegTypes[reg] == TyFloat64)
        {
            this->floatRegs.Set(reg);
            numFloatRegs++;
        }
        if (LinearScan::IsCallerSaved(reg))
        {
            this->callerSavedRegs.Set(reg);
        }
        if (LinearScan::IsCalleeSaved(reg))
        {
            this->calleeSavedRegs.Set(reg);
        }
        this->regContent[reg] = nullptr;
    } NEXT_REG;

    this->instrUseRegs.ClearAll();
    this->secondChanceRegs.ClearAll();

    this->linearScanMD.Init(this);

#if DBG
    this->nonAllocatableRegs = this->activeRegs;
#endif

#if DBG_DUMP
    if (PHASE_TRACE(Js::LinearScanPhase, this->func))
    {
        this->func->DumpHeader();
    }
#endif
}